

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *interfaceNode,Reader *replacement)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  ListElementCount LVar4;
  WirePointer WVar5;
  WirePointer WVar6;
  CapTableReader *pCVar7;
  int iVar8;
  size_t sVar9;
  ElementCount EVar10;
  SegmentReader *pSVar11;
  SegmentReader *pSVar12;
  Vector<unsigned_long> replacementSuperclasses;
  Vector<unsigned_long> superclasses;
  Reader replacementMethods;
  Reader methods;
  StructReader local_108;
  StructReader local_d8;
  Reader *local_a0;
  Reader *local_98;
  ListReader local_90;
  ListReader local_60;
  
  local_d8.segment = (SegmentReader *)0x0;
  local_d8.capTable = (CapTableReader *)0x0;
  local_90.capTable = (CapTableReader *)0x0;
  local_d8.data = (SegmentReader *)0x0;
  local_d8.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  local_108.data = (SegmentReader *)0x0;
  local_108.segment = (SegmentReader *)0x0;
  local_108.capTable = (CapTableReader *)0x0;
  local_108.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  local_90.elementCount = 0x7fffffff;
  local_90.ptr = (byte *)0x0;
  local_90.segment = (SegmentReader *)0x0;
  if (4 < (interfaceNode->_reader).pointerCount) {
    local_90.segment = (interfaceNode->_reader).segment;
    local_90.capTable = (interfaceNode->_reader).capTable;
    local_90.ptr = (byte *)((interfaceNode->_reader).pointers + 4);
    local_90.elementCount = (interfaceNode->_reader).nestingLimit;
  }
  local_a0 = replacement;
  local_98 = interfaceNode;
  _::PointerReader::getList(&local_60,(PointerReader *)&local_90,INLINE_COMPOSITE,(word *)0x0);
  LVar4 = local_60.elementCount;
  if (local_60.elementCount != 0) {
    EVar10 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_90,&local_60,EVar10);
      if (local_90.structDataSize < 0x40) {
        WVar5.offsetAndKind.value = 0;
        WVar5.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar5 = *(WirePointer *)local_90.ptr;
      }
      if (local_d8.capTable == (CapTableReader *)local_d8.data) {
        sVar9 = (long)local_d8.data - (long)local_d8.segment >> 2;
        if ((SegmentReader *)local_d8.data == local_d8.segment) {
          sVar9 = 4;
        }
        kj::Vector<unsigned_long>::setCapacity((Vector<unsigned_long> *)&local_d8,sVar9);
      }
      (local_d8.capTable)->_vptr_CapTableReader = (_func_int **)WVar5;
      local_d8.capTable = (CapTableReader *)((long)local_d8.capTable + 8);
      EVar10 = EVar10 + 1;
    } while (LVar4 != EVar10);
  }
  if ((local_a0->_reader).pointerCount < 5) {
    local_90.elementCount = 0x7fffffff;
    local_90.capTable = (CapTableReader *)0x0;
    local_90.ptr = (byte *)0x0;
    local_90.segment = (SegmentReader *)0x0;
  }
  else {
    local_90.segment = (local_a0->_reader).segment;
    local_90.capTable = (local_a0->_reader).capTable;
    local_90.ptr = (byte *)((local_a0->_reader).pointers + 4);
    local_90.elementCount = (local_a0->_reader).nestingLimit;
  }
  _::PointerReader::getList(&local_60,(PointerReader *)&local_90,INLINE_COMPOSITE,(word *)0x0);
  LVar4 = local_60.elementCount;
  if (local_60.elementCount != 0) {
    EVar10 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_90,&local_60,EVar10);
      if (local_90.structDataSize < 0x40) {
        WVar6.offsetAndKind.value = 0;
        WVar6.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar6 = *(WirePointer *)local_90.ptr;
      }
      if (local_108.capTable == (CapTableReader *)local_108.data) {
        sVar9 = (long)local_108.data - (long)local_108.segment >> 2;
        if ((SegmentReader *)local_108.data == local_108.segment) {
          sVar9 = 4;
        }
        kj::Vector<unsigned_long>::setCapacity((Vector<unsigned_long> *)&local_108,sVar9);
      }
      (local_108.capTable)->_vptr_CapTableReader = (_func_int **)WVar6;
      local_108.capTable = (CapTableReader *)((long)local_108.capTable + 8);
      EVar10 = EVar10 + 1;
    } while (LVar4 != EVar10);
  }
  pCVar7 = local_d8.capTable;
  pSVar11 = local_d8.segment;
  if (local_d8.segment != (SegmentReader *)local_d8.capTable) {
    uVar3 = (long)local_d8.capTable - (long)local_d8.segment >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8.segment,local_d8.capTable,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar11,pCVar7);
  }
  pCVar7 = local_108.capTable;
  pSVar11 = local_108.segment;
  pSVar12 = local_d8.segment;
  if (local_108.segment != (SegmentReader *)local_108.capTable) {
    uVar3 = (long)local_108.capTable - (long)local_108.segment >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_108.segment,local_108.capTable,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar11,pCVar7);
    pSVar11 = local_108.segment;
    pSVar12 = local_d8.segment;
  }
  while( true ) {
    if ((pSVar12 == (SegmentReader *)local_d8.capTable) &&
       (pSVar11 == (SegmentReader *)local_108.capTable)) goto LAB_001ab184;
    if (pSVar12 == (SegmentReader *)local_d8.capTable) break;
    if (pSVar11 == (SegmentReader *)local_108.capTable) {
      replacementIsOlder(this);
LAB_001ab184:
      pvVar2 = local_108.data;
      pCVar7 = local_108.capTable;
      pSVar11 = local_108.segment;
      if (local_108.segment != (SegmentReader *)0x0) {
        local_108.segment = (SegmentReader *)0x0;
        local_108.capTable = (CapTableReader *)0x0;
        local_108.data = (SegmentReader *)0x0;
        (**(code **)*local_108.pointers)
                  (local_108.pointers,pSVar11,8,(long)pCVar7 - (long)pSVar11 >> 3,
                   (long)pvVar2 - (long)pSVar11 >> 3,0);
      }
      pvVar2 = local_d8.data;
      pCVar7 = local_d8.capTable;
      pSVar11 = local_d8.segment;
      if (local_d8.segment != (SegmentReader *)0x0) {
        local_d8.segment = (SegmentReader *)0x0;
        local_d8.capTable = (CapTableReader *)0x0;
        local_d8.data = (SegmentReader *)0x0;
        (**(code **)*local_d8.pointers)
                  (local_d8.pointers,pSVar11,8,(long)pCVar7 - (long)pSVar11 >> 3,
                   (long)pvVar2 - (long)pSVar11 >> 3,0);
      }
      iVar8 = 0x7fffffff;
      if ((local_98->_reader).pointerCount < 4) {
        local_90.capTable = (CapTableReader *)0x0;
        local_90.ptr = (byte *)0x0;
        local_90.segment = (SegmentReader *)0x0;
        local_90.elementCount = 0x7fffffff;
      }
      else {
        local_90.segment = (local_98->_reader).segment;
        local_90.capTable = (local_98->_reader).capTable;
        local_90.ptr = (byte *)((local_98->_reader).pointers + 3);
        local_90.elementCount = (local_98->_reader).nestingLimit;
      }
      pCVar7 = (CapTableReader *)0x0;
      _::PointerReader::getList(&local_60,(PointerReader *)&local_90,INLINE_COMPOSITE,(word *)0x0);
      local_d8.data = (WirePointer *)0x0;
      local_d8.segment = (SegmentReader *)0x0;
      if (3 < (local_a0->_reader).pointerCount) {
        local_d8.segment = (local_a0->_reader).segment;
        pCVar7 = (local_a0->_reader).capTable;
        local_d8.data = (local_a0->_reader).pointers + 3;
        iVar8 = (local_a0->_reader).nestingLimit;
      }
      local_d8.pointers = (WirePointer *)CONCAT44(local_d8.pointers._4_4_,iVar8);
      local_d8.capTable = pCVar7;
      _::PointerReader::getList(&local_90,(PointerReader *)&local_d8,INLINE_COMPOSITE,(word *)0x0);
      if (local_60.elementCount < local_90.elementCount) {
        replacementIsNewer(this);
      }
      else if (local_90.elementCount < local_60.elementCount) {
        replacementIsOlder(this);
      }
      LVar4 = local_90.elementCount;
      if (local_60.elementCount < local_90.elementCount) {
        LVar4 = local_60.elementCount;
      }
      if (LVar4 != 0) {
        EVar10 = 0;
        do {
          _::ListReader::getStructElement(&local_d8,&local_60,EVar10);
          _::ListReader::getStructElement(&local_108,&local_90,EVar10);
          checkCompatibility(this,(Reader *)&local_d8,(Reader *)&local_108);
          EVar10 = EVar10 + 1;
        } while (LVar4 != EVar10);
      }
      return;
    }
    if (pSVar12->arena < pSVar11->arena) {
      replacementIsOlder(this);
      pSVar12 = (SegmentReader *)&pSVar12->id;
    }
    else {
      if (pSVar11->arena < pSVar12->arena) {
        replacementIsNewer(this);
      }
      else {
        pSVar12 = (SegmentReader *)&pSVar12->id;
      }
      pSVar11 = (SegmentReader *)&pSVar11->id;
    }
  }
  replacementIsNewer(this);
  goto LAB_001ab184;
}

Assistant:

void checkCompatibility(const schema::Node::Interface::Reader& interfaceNode,
                          const schema::Node::Interface::Reader& replacement) {
    {
      // Check superclasses.

      kj::Vector<uint64_t> superclasses;
      kj::Vector<uint64_t> replacementSuperclasses;
      for (auto superclass: interfaceNode.getSuperclasses()) {
        superclasses.add(superclass.getId());
      }
      for (auto superclass: replacement.getSuperclasses()) {
        replacementSuperclasses.add(superclass.getId());
      }
      std::sort(superclasses.begin(), superclasses.end());
      std::sort(replacementSuperclasses.begin(), replacementSuperclasses.end());

      auto iter = superclasses.begin();
      auto replacementIter = replacementSuperclasses.begin();

      while (iter != superclasses.end() || replacementIter != replacementSuperclasses.end()) {
        if (iter == superclasses.end()) {
          replacementIsNewer();
          break;
        } else if (replacementIter == replacementSuperclasses.end()) {
          replacementIsOlder();
          break;
        } else if (*iter < *replacementIter) {
          replacementIsOlder();
          ++iter;
        } else if (*iter > *replacementIter) {
          replacementIsNewer();
          ++replacementIter;
        } else {
          ++iter;
          ++replacementIter;
        }
      }
    }

    auto methods = interfaceNode.getMethods();
    auto replacementMethods = replacement.getMethods();

    if (replacementMethods.size() > methods.size()) {
      replacementIsNewer();
    } else if (replacementMethods.size() < methods.size()) {
      replacementIsOlder();
    }

    uint count = kj::min(methods.size(), replacementMethods.size());

    for (uint i = 0; i < count; i++) {
      checkCompatibility(methods[i], replacementMethods[i]);
    }
  }